

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

void store_maint(store *s)

{
  bitflag *pbVar1;
  byte bVar2;
  object_kind **ppoVar3;
  wchar_t max;
  _Bool _Var4;
  uint32_t uVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  ulong uVar8;
  object *poVar9;
  object *poVar10;
  object_kind *poVar11;
  uint8_t uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  object **ppoVar16;
  int iVar17;
  int A;
  bool bVar18;
  object *obj;
  int local_44;
  object *local_40;
  int local_34;
  
  if (s->sidx != store_home_idx) {
    if (s->sidx == store_black_market_idx) {
      poVar10 = s->stock;
      while (poVar9 = poVar10, poVar9 != (object *)0x0) {
        poVar10 = poVar9->next;
        _Var4 = black_market_ok(s->town,poVar9);
        if (!_Var4) {
          if (poVar9->artifact != (artifact *)0x0) {
            history_lose_artifact(player,poVar9->artifact);
          }
          store_delete(s,poVar9,(uint)poVar9->number);
        }
      }
    }
    if (s->turnover == L'\0') {
      if ((s->always_num != 0) && (s->stock_num != 0)) {
        uVar5 = Rand_div((uint)s->stock_num);
        iVar17 = uVar5 + 1;
        while (bVar18 = iVar17 != 0, iVar17 = iVar17 + -1, bVar18) {
          store_delete_random(s);
        }
      }
    }
    else {
      bVar2 = s->stock_num;
      uVar5 = Rand_div(s->turnover);
      wVar6 = ~uVar5 + (uint)bVar2;
      wVar7 = L'\0';
      if (L'\0' < wVar6) {
        wVar7 = wVar6;
      }
      if (s->normal_stock_max <= wVar7) {
        wVar7 = s->normal_stock_max;
      }
      iVar17 = -99999;
      while (wVar7 < (int)(uint)s->stock_num) {
        if (iVar17 == 0) {
          quit_fmt("Unable to (de-)stock store %d. Please report this bug",(ulong)(s->sidx + 1));
          break;
        }
        store_delete_random(s);
        iVar17 = iVar17 + 1;
      }
    }
    uVar8 = s->always_num;
    if (uVar8 != 0) {
      for (uVar15 = 0; uVar15 < uVar8; uVar15 = uVar15 + 1) {
        poVar11 = s->always_table[uVar15];
        ppoVar16 = &s->stock;
        if (poVar11 == (object_kind *)0x0) {
          __assert_fail("k",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                        ,0x4d3,
                        "struct object *store_find_kind(struct store *, struct object_kind *, _Bool (*)(struct store *, struct object *))"
                       );
        }
        while (poVar10 = *ppoVar16, poVar10 != (object *)0x0) {
          if ((poVar10->kind == poVar11) &&
             (_Var4 = store_sale_should_reduce_stock(s,poVar10), !_Var4)) goto LAB_001c1a9b;
          ppoVar16 = &poVar10->next;
        }
        poVar9 = object_new();
        obj = poVar9;
        poVar10 = object_new();
        local_40 = poVar10;
        object_prep(poVar9,poVar11,L'\0',RANDOMISE);
        if (poVar9->artifact != (artifact *)0x0) {
          __assert_fail("!obj->artifact",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                        ,0x5d2,
                        "struct object *store_create_item(struct store *, struct object_kind *)");
        }
        poVar9->known = poVar10;
        poVar10->notice = poVar10->notice | 2;
        object_set_base_known(player,poVar9);
        pbVar1 = &poVar9->known->notice;
        *pbVar1 = *pbVar1 | 2;
        player_know_object(player,poVar9);
        poVar9->origin = '\0';
        poVar10 = store_carry(s,poVar9);
        if (poVar10 == (object *)0x0) {
          object_delete((chunk *)0x0,(chunk *)0x0,&local_40);
          poVar9->known = (object *)0x0;
          object_delete((chunk *)0x0,(chunk *)0x0,&obj);
        }
        else {
LAB_001c1a9b:
          uVar12 = (uint8_t)poVar10->kind->base->max_stack;
          poVar10->number = uVar12;
          poVar10->known->number = uVar12;
        }
        uVar8 = s->always_num;
      }
    }
    if (s->turnover != L'\0') {
      bVar2 = s->stock_num;
      uVar5 = Rand_div(s->turnover);
      local_34 = (int)s->always_num;
      iVar13 = s->normal_stock_min + local_34;
      local_34 = local_34 + s->normal_stock_max;
      iVar17 = uVar5 + bVar2 + 1;
      if (iVar17 < local_34) {
        local_34 = iVar17;
      }
      if (local_34 <= iVar13) {
        local_34 = iVar13;
      }
      iVar17 = 100000;
LAB_001c1b2b:
      if ((int)(uint)s->stock_num < local_34) {
        if (iVar17 + -1 == 0) {
          quit_fmt("Unable to (re-)stock store %d. Please report this bug",(ulong)(s->sidx + 1));
          return;
        }
        if (s->sidx == store_black_market_idx) {
          A = player->max_depth + 5;
          iVar13 = player->max_depth + 0x14;
        }
        else {
          iVar13 = player->max_depth + -0x14;
          if (player->max_depth < 0x14) {
            iVar13 = 0;
          }
          iVar13 = iVar13 + (uint)z_info->store_magic_level;
          A = 1;
        }
        if (0x36 < A) {
          A = 0x37;
        }
        if (0x45 < iVar13) {
          iVar13 = 0x46;
        }
        iVar14 = 6;
        local_44 = iVar17 + -1;
        while (bVar18 = iVar14 != 0, iVar14 = iVar14 + -1, iVar17 = local_44, bVar18) {
          wVar7 = rand_range(A,iVar13);
          if (s->sidx == store_black_market_idx) {
            poVar11 = get_obj_num(wVar7,false,L'\0');
          }
          else {
            ppoVar3 = s->normal_table;
            uVar5 = Rand_div((uint32_t)s->normal_num);
            poVar11 = ppoVar3[(int)uVar5];
          }
          if (poVar11->tval != L'\x01') {
            obj = object_new();
            object_prep(obj,poVar11,wVar7,RANDOMISE);
            apply_magic(obj,wVar7,false,false,false,false);
            if (obj->artifact != (artifact *)0x0) {
              __assert_fail("!obj->artifact",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                            ,0x58b,"_Bool store_create_random(struct store *)");
            }
            _Var4 = tval_is_weapon(obj);
            if ((((_Var4) && ((obj->to_h < 0 || (obj->to_d < 0)))) ||
                ((_Var4 = tval_is_armor(obj), _Var4 && (obj->to_a < 0)))) ||
               (obj->curses != (curse_data *)0x0)) goto LAB_001c1e1b;
            local_40 = object_new();
            obj->known = local_40;
            local_40->notice = local_40->notice | 2;
            object_set_base_known(player,obj);
            pbVar1 = &obj->known->notice;
            *pbVar1 = *pbVar1 | 2;
            player_know_object(player,obj);
            obj->origin = '\0';
            if (((s->sidx == store_black_market_idx) &&
                (_Var4 = black_market_ok(s->town,obj), !_Var4)) ||
               (wVar7 = object_value_real(obj,L'\x01'), poVar10 = obj, wVar7 < L'\x01'))
            goto LAB_001c1e03;
            wVar7 = object_value_real(obj,L'\x01');
            wVar6 = L'\x01';
            switch(poVar10->tval) {
            case '\x02':
            case '\x03':
            case '\x04':
              if (wVar7 < L'\x06') {
                uVar5 = Rand_div(2);
                wVar6 = uVar5 * 0x14 + L'\x14';
              }
              else if ((uint)wVar7 < 0x33) {
                uVar5 = Rand_div(4);
                wVar6 = uVar5 * 10 + L'\n';
              }
              else if ((uint)wVar7 < 0x1f5) {
                uVar5 = Rand_div(4);
                wVar6 = uVar5 * 5 + L'\x05';
              }
              break;
            case '\x05':
            case '\x06':
            case '\a':
            case '\b':
            case '\t':
            case '\n':
            case '\v':
            case '\f':
            case '\r':
            case '\x0e':
            case '\x0f':
            case '\x10':
            case '\x11':
              if (poVar10->ego == (ego_item *)0x0) {
                if (wVar7 < L'\v') goto LAB_001c1d88;
                if ((uint)wVar7 < 0x65) goto LAB_001c1d99;
              }
              break;
            case '\x13':
            case '\x1b':
            case '\x1c':
            case '\x1d':
              if (wVar7 < L'\x06') {
LAB_001c1d88:
                wVar6 = mass_roll(L'\x03',L'\x05');
                wVar6 = wVar6 + L'\x01';
              }
              else if (0x14 < (uint)wVar7) break;
LAB_001c1d99:
              wVar7 = L'\x03';
              goto LAB_001c1d9b;
            case '\x19':
            case '\x1a':
              if (wVar7 < L'=') {
                wVar6 = mass_roll(L'\x03',L'\x05');
                wVar6 = wVar6 + L'\x01';
              }
              else if (0xf0 < (uint)wVar7) break;
              wVar7 = L'\x01';
LAB_001c1d9b:
              max = L'\x05';
LAB_001c1dc9:
              wVar7 = mass_roll(wVar7,max);
              wVar6 = wVar7 + wVar6;
              break;
            case '\x1e':
            case '\x1f':
            case ' ':
            case '!':
            case '\"':
              if (wVar7 < L'3') {
                wVar6 = mass_roll(L'\x02',L'\x03');
                wVar6 = wVar6 + L'\x01';
              }
              else if (500 < (uint)wVar7) break;
              wVar7 = L'\x01';
              max = L'\x03';
              goto LAB_001c1dc9;
            }
            wVar7 = poVar10->kind->base->max_stack;
            uVar12 = (uint8_t)wVar7;
            if (wVar6 < wVar7) {
              uVar12 = (uint8_t)wVar6;
            }
            poVar10->number = uVar12;
            poVar10 = store_carry(s,obj);
            iVar17 = local_44;
            if (poVar10 != (object *)0x0) break;
LAB_001c1e03:
            object_delete((chunk *)0x0,(chunk *)0x0,&local_40);
            obj->known = (object *)0x0;
LAB_001c1e1b:
            object_delete((chunk *)0x0,(chunk *)0x0,&obj);
          }
        }
        goto LAB_001c1b2b;
      }
    }
  }
  return;
}

Assistant:

static void store_maint(struct store *s)
{
	/* Ignore home */
	if (store_is_home(s))
		return;

	/* Destroy crappy black market items */
	if (store_is_black_market(s)) {
		struct object *obj = s->stock;
		while (obj) {
			struct object *next = obj->next;
			if (!black_market_ok(s->town, obj)) {
				if (obj->artifact) {
					history_lose_artifact(player,
										  obj->artifact);
				}
				store_delete(s, obj, obj->number);
			}
			obj = next;
		}
	}

	/* We want to make sure stores have staple items. If there's
	 * turnover, we also want to delete a few items, and add a few
	 * items.
	 *
	 * If we create staple items, then delete items, then create new
	 * items, we are stuck with one of three choices:
	 * 1. We can risk deleting staple items, and not having any left.
	 * 2. We can refuse to delete staple items, and risk having that
	 * become an infinite loop.
	 * 3. We can do a ton of extra bookkeeping to make sure we delete
	 * staple items only if there's duplicates of them.
	 *
	 * What if we change the order? First sell a handful of random items,
	 * then create any missing staples, then create new items. This
	 * has two tests for s->turnover, but simplifies everything else
	 * dramatically.
	 */

	if (s->turnover) {
		int restock_attempts = 100000;
		int stock = s->stock_num - randint1(s->turnover);

		/* We'll end up adding staples for sure, maybe plus other
		 * items. It's fine if we sell out completely, though, if
		 * turnover is high. The cap doesn't include always_num,
		 * because otherwise the addition of missing staples could
		 * put us over (if the store was full of player-sold loot).
		 */
		int min = 0;
		int max = s->normal_stock_max;

		if (stock < min) stock = min;
		if (stock > max) stock = max;

		/* Destroy random objects until only "stock" slots are left */
		while (s->stock_num > stock && --restock_attempts)
			store_delete_random(s);

		if (!restock_attempts)
			quit_fmt("Unable to (de-)stock store %d. Please report this bug",
					 s->sidx + 1);
	} else {
		/* For the Bookseller, occasionally sell a book */
		if (s->always_num && s->stock_num) {
			int sales = randint1(s->stock_num);
			while (sales--) {
				store_delete_random(s);
			}
		}
	}

	/* Ensure staples are created */
	if (s->always_num) {
		size_t i;
		for (i = 0; i < s->always_num; i++) {
			struct object_kind *kind = s->always_table[i];
			struct object *obj = store_find_kind(s, kind,
				store_sale_should_reduce_stock);

			/* Create the item if it doesn't exist */
			if (!obj) {
				obj = store_create_item(s, kind);
				if (!obj) continue;
			}

			/* Ensure a full stack */
			obj->number = obj->kind->base->max_stack;
			obj->known->number = obj->kind->base->max_stack;
		}
	}

	if (s->turnover) {
		int restock_attempts = 100000;
		int stock = s->stock_num + randint1(s->turnover);

		/* Now that the staples exist, we want to add more
		 * items, at least enough to get us to normal_stock_min
		 * items that aren't necessarily staples.
		 */

		int min = s->normal_stock_min + s->always_num;
		int max = s->normal_stock_max + s->always_num;

		/* Buy a few items */

		/* Keep stock between specified min and max slots */
		if (stock > max) stock = max;
		if (stock < min) stock = min;

		/* For the rest, we just choose items randomlyish */
		/* The (huge) restock_attempts will only go to zero (otherwise
		 * infinite loop) if stores don't have enough items they can stock! */
		while (s->stock_num < stock && --restock_attempts)
			store_create_random(s);

		if (!restock_attempts)
			quit_fmt("Unable to (re-)stock store %d. Please report this bug",
					 s->sidx + 1);
	}
}